

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O2

int tnt_reply_from(tnt_reply *r,tnt_reply_t rcv,void *ptr)

{
  int iVar1;
  ssize_t sVar2;
  char *size;
  char *pcVar3;
  char *local_40;
  char *data;
  size_t hdr_length;
  char length [5];
  
  *(undefined8 *)r = 0;
  r->bitmap = 0;
  r->buf = (char *)0x0;
  r->buf_size = 0;
  r->code = 0;
  r->sync = 0;
  r->schema_id = 0;
  r->error = (char *)0x0;
  r->error_end = (char *)0x0;
  r->data = (char *)0x0;
  r->data_end = (char *)0x0;
  r->metadata = (char *)0x0;
  r->sqlinfo_end = (char *)0x0;
  r->metadata_end = (char *)0x0;
  r->sqlinfo = (char *)0x0;
  r->alloc = r->alloc;
  local_40 = (char *)((long)&hdr_length + 3);
  sVar2 = (*rcv)(ptr,local_40,5);
  if ((sVar2 != -1) && (mp_type_hint[hdr_length._3_1_] == MP_UINT)) {
    size = (char *)mp_decode_uint(&local_40);
    pcVar3 = (char *)tnt_mem_alloc((size_t)size);
    r->buf = pcVar3;
    r->buf_size = (size_t)size;
    if ((pcVar3 != (char *)0x0) &&
       ((sVar2 = (*rcv)(ptr,pcVar3,(ssize_t)size), sVar2 != -1 &&
        (iVar1 = tnt_reply_hdr0(r,r->buf,r->buf_size,(size_t *)&data), iVar1 == 0)))) {
      if (size == data) {
        return 0;
      }
      iVar1 = tnt_reply_body0(r,r->buf + (long)data,r->buf_size - (long)data,(size_t *)0x0);
      if (iVar1 == 0) {
        return 0;
      }
    }
  }
  if (r->buf != (char *)0x0) {
    tnt_mem_free(r->buf);
  }
  *(undefined8 *)r = 0;
  r->bitmap = 0;
  r->buf = (char *)0x0;
  r->buf_size = 0;
  r->code = 0;
  r->sync = 0;
  r->schema_id = 0;
  r->error = (char *)0x0;
  r->error_end = (char *)0x0;
  r->data = (char *)0x0;
  r->sqlinfo_end = (char *)0x0;
  r->data_end = (char *)0x0;
  r->metadata = (char *)0x0;
  r->metadata_end = (char *)0x0;
  r->sqlinfo = (char *)0x0;
  r->alloc = r->alloc;
  return -1;
}

Assistant:

int tnt_reply_from(struct tnt_reply *r, tnt_reply_t rcv, void *ptr) {
	/* cleanup, before processing response */
	int alloc = r->alloc;
	memset(r, 0 , sizeof(struct tnt_reply));
	r->alloc = alloc;
	/* reading iproto header */
	char length[TNT_REPLY_IPROTO_HDR_SIZE]; const char *data = (const char *)length;
	if (rcv(ptr, length, sizeof(length)) == -1)
		goto rollback;
	if (mp_typeof(*length) != MP_UINT)
		goto rollback;
	size_t size = mp_decode_uint(&data);
	r->buf = tnt_mem_alloc(size);
	r->buf_size = size;
	if (r->buf == NULL)
		goto rollback;
	if(rcv(ptr, (char *)r->buf, size) == -1)
		goto rollback;
	size_t hdr_length;
	if (tnt_reply_hdr0(r, r->buf, r->buf_size, &hdr_length) != 0)
		goto rollback;
	if (size == (size_t)hdr_length)
		return 0; /* no body */
	if (tnt_reply_body0(r, r->buf + hdr_length, r->buf_size - hdr_length, NULL) != 0)
		goto rollback;

	return 0;
rollback:
	if (r->buf) tnt_mem_free((void *)r->buf);
	alloc = r->alloc;
	memset(r, 0, sizeof(struct tnt_reply));
	r->alloc = alloc;
	return -1;
}